

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec08.c
# Opt level: O3

void If_Dec08Verify(word *pF,int nVars,uint *pZ)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  word *pwVar10;
  word *pG [4];
  word pN [16] [16];
  long alStack_8d8 [4];
  ulong local_8b8 [16];
  word awStack_838 [257];
  
  uVar7 = (ulong)(uint)nVars;
  uVar2 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar2 = 1;
  }
  uVar4 = (ulong)uVar2;
  if (nVars < 1) {
    uVar7 = 0;
  }
  else {
    lVar9 = 0;
    do {
      if (0 < (int)uVar2) {
        memcpy((void *)((long)awStack_838 + lVar9),(void *)((long)Truth10[0] + lVar9),uVar4 * 8);
      }
      lVar9 = lVar9 + 0x80;
    } while (uVar7 << 7 != lVar9);
  }
  uVar3 = *pZ;
  if (uVar3 != 0) {
    pwVar10 = awStack_838 + uVar7 * 0x10;
    lVar9 = 0;
    do {
      lVar5 = 0;
      do {
        *(ulong *)((long)alStack_8d8 + lVar5 * 2) =
             (long)awStack_838 + (ulong)((uVar3 >> ((char)lVar5 + 0x10U & 0x1f) & 7) << 7);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x10);
      if (10 < nVars) {
        __assert_fail("nVars <= 10",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec08.c"
                      ,0x6b,"void If_Dec08ComposeLut4(int, word **, word *, int)");
      }
      uVar8 = 0;
      memset(awStack_838 + uVar7 * 0x10,0,uVar4 * 8);
      do {
        if (((uVar3 & 0xffff) >> (uVar8 & 0x1f) & 1) != 0) {
          memset(local_8b8,0xff,uVar4 * 8);
          lVar5 = 0;
          do {
            lVar1 = alStack_8d8[lVar5];
            uVar6 = 0;
            do {
              local_8b8[uVar6] =
                   local_8b8[uVar6] &
                   (*(ulong *)(lVar1 + uVar6 * 8) ^
                   (ulong)((uVar8 >> ((uint)lVar5 & 0x1f) & 1) != 0) - 1);
              uVar6 = uVar6 + 1;
            } while (uVar4 != uVar6);
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          uVar6 = 0;
          do {
            pwVar10[uVar6] = pwVar10[uVar6] | local_8b8[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != 0x10);
      uVar7 = uVar7 + 1;
      uVar3 = pZ[lVar9 + 1];
      lVar9 = lVar9 + 1;
      pwVar10 = pwVar10 + 0x10;
    } while (uVar3 != 0);
  }
  if (0 < (int)uVar2) {
    uVar6 = 0;
    do {
      if ((awStack_838 + ((long)(int)uVar7 + -1) * 0x10)[uVar6] != pF[uVar6]) {
        If_Dec08PrintConfig(pZ);
        Kit_DsdPrintFromTruth((uint *)pF,nVars);
        putchar(10);
        Kit_DsdPrintFromTruth((uint *)(awStack_838 + ((long)(int)uVar7 + -1) * 0x10),nVars);
        putchar(10);
        puts("Verification failed!");
        return;
      }
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  return;
}

Assistant:

void If_Dec08Verify( word * pF, int nVars, unsigned * pZ )
{
    word pN[16][16], * pG[4];
    int i, w, v, k, nWords;
    unsigned z;
    nWords = If_Dec08WordNum( nVars );
    for ( k = 0; k < nVars; k++ )
        for ( w = 0; w < nWords; w++ )
            pN[k][w] = Truth10[k][w];
    for ( i = 0; (z = pZ[i]); i++, k++ )
    {
        for ( v = 0; v < 4; v++ )
            pG[v] = pN[ (z >> (16+(v<<2))) & 7 ];
        If_Dec08ComposeLut4( (int)(z & 0xffff), pG, pN[k], nVars );
    }
    k--;
    for ( w = 0; w < nWords; w++ )
        if ( pN[k][w] != pF[w] )
        {
            If_Dec08PrintConfig( pZ );
            Kit_DsdPrintFromTruth( (unsigned*)pF, nVars ); printf( "\n" );
            Kit_DsdPrintFromTruth( (unsigned*)pN[k], nVars ); printf( "\n" );
            printf( "Verification failed!\n" );
            break;
        }
}